

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::FillCMakeVariablePath(cmFindBase *this)

{
  undefined8 uVar1;
  bool bVar2;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string var;
  cmSearchPath *paths;
  cmFindBase *this_local;
  
  var.field_2._8_8_ =
       std::
       map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
       ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"CMAKE_",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=
            ((string *)local_38,(string *)&(this->super_cmFindCommon).CMakePathName);
  std::__cxx11::string::operator+=((string *)local_38,"_PATH");
  uVar1 = var.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CMAKE_PREFIX_PATH",&local_71);
  cmSearchPath::AddCMakePrefixPath((cmSearchPath *)uVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cmSearchPath::AddCMakePath((cmSearchPath *)var.field_2._8_8_,(string *)local_38);
  bVar2 = std::operator==(&(this->super_cmFindCommon).CMakePathName,"PROGRAM");
  uVar1 = var.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"CMAKE_APPBUNDLE_PATH",&local_99);
    cmSearchPath::AddCMakePath((cmSearchPath *)uVar1,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"CMAKE_FRAMEWORK_PATH",&local_c1);
    cmSearchPath::AddCMakePath((cmSearchPath *)uVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  cmSearchPath::AddSuffixes
            ((cmSearchPath *)var.field_2._8_8_,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmFindBase::FillCMakeVariablePath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMake];

  // Add CMake varibles of the same name as the previous environment
  // varibles CMAKE_*_PATH to be used most of the time with -D
  // command line options
  std::string var = "CMAKE_";
  var += this->CMakePathName;
  var += "_PATH";
  paths.AddCMakePrefixPath("CMAKE_PREFIX_PATH");
  paths.AddCMakePath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
  } else {
    paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}